

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

void __thiscall V2Synth::setGlobals(V2Synth *this,uint8_t *para)

{
  float fVar1;
  int local_24;
  int i;
  float *globf;
  uint8_t *para_local;
  V2Synth *this_local;
  
  if ((this->initialized & 1U) != 0) {
    for (local_24 = 0; local_24 < 0x17; local_24 = local_24 + 1) {
      *(float *)((this->globals)._pad + (long)local_24 * 4 + -0x59) = (float)para[local_24];
    }
    V2Reverb::set(&this->reverb,&(this->globals).rvbparm);
    V2ModDel::set(&this->delay,&(this->globals).delparm);
    V2Comp::set(&this->compr,&(this->globals).cprparm);
    fVar1 = sqr(((this->globals).vlowcut + 1.0) / 128.0);
    this->lcfreq = fVar1;
    fVar1 = sqr(((this->globals).vhighcut + 1.0) / 128.0);
    this->hcfreq = fVar1;
  }
  return;
}

Assistant:

void setGlobals(const uint8_t *para)
    {
        if (!initialized)
            return;

        // copy over
        float *globf = (float *)&globals;
        for (int i = 0; i < (int)(sizeof(globals)/sizeof(float)); i++)
            globf[i] = para[i];

        // set
        reverb.set(&globals.rvbparm);
        delay.set(&globals.delparm);
        compr.set(&globals.cprparm);
        lcfreq = sqr((globals.vlowcut + 1.0f) / 128.0f);
        hcfreq = sqr((globals.vhighcut + 1.0f) / 128.0f);
    }